

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

void __thiscall
basisu::vector<unsigned_char>::reserve(vector<unsigned_char> *this,size_t new_capacity_size_t)

{
  uchar *__ptr;
  undefined8 uVar1;
  uint min_new_capacity;
  vector<unsigned_char> local_18;
  
  if (new_capacity_size_t >> 0x20 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x1e3,"void basisu::vector<unsigned char>::reserve(size_t) [T = unsigned char]");
  }
  min_new_capacity = (uint)new_capacity_size_t;
  if (this->m_capacity < min_new_capacity) {
    increase_capacity(this,min_new_capacity,false,false);
    return;
  }
  if (min_new_capacity < this->m_capacity) {
    local_18.m_p = (uchar *)0x0;
    local_18.m_size = 0;
    local_18.m_capacity = 0;
    if (min_new_capacity < this->m_size) {
      min_new_capacity = this->m_size;
    }
    increase_capacity(&local_18,min_new_capacity,false,false);
    operator=(&local_18,this);
    __ptr = this->m_p;
    this->m_p = local_18.m_p;
    uVar1._0_4_ = this->m_size;
    uVar1._4_4_ = this->m_capacity;
    this->m_size = local_18.m_size;
    this->m_capacity = local_18.m_capacity;
    local_18.m_p = __ptr;
    local_18._8_8_ = uVar1;
    free(__ptr);
  }
  return;
}

Assistant:

inline void reserve(size_t new_capacity_size_t)
      {
         if (new_capacity_size_t > UINT32_MAX)
         {
            assert(0);
            return;
         }

         uint32_t new_capacity = (uint32_t)new_capacity_size_t;

         if (new_capacity > m_capacity)
            increase_capacity(new_capacity, false);
         else if (new_capacity < m_capacity)
         {
            // Must work around the lack of a "decrease_capacity()" method.
            // This case is rare enough in practice that it's probably not worth implementing an optimized in-place resize.
            vector tmp;
            tmp.increase_capacity(helpers::maximum(m_size, new_capacity), false);
            tmp = *this;
            swap(tmp);
         }
      }